

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEditControl::insertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  code *UNRECOVERED_JUMPTABLE;
  QPlainTextEdit *pQVar1;
  undefined8 extraout_RDX;
  
  pQVar1 = QtPrivate::qobject_cast_helper<QPlainTextEdit*,QObject>
                     (*(QObject **)(*(long *)&(this->super_QWidgetTextControl).field_0x8 + 0x10));
  if (pQVar1 != (QPlainTextEdit *)0x0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1e0
                   );
    (*UNRECOVERED_JUMPTABLE)(pQVar1,source,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  QWidgetTextControl::insertFromMimeData((QWidgetTextControl *)this,source);
  return;
}

Assistant:

void QPlainTextEditControl::insertFromMimeData(const QMimeData *source) {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        QWidgetTextControl::insertFromMimeData(source);
    else
        ed->insertFromMimeData(source);
}